

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.h
# Opt level: O0

uint glsl_base_type_get_bit_size(glsl_base_type base_type)

{
  uint local_c;
  glsl_base_type base_type_local;
  
  switch(base_type) {
  case GLSL_TYPE_UINT:
  case GLSL_TYPE_INT:
  case GLSL_TYPE_FLOAT:
  case GLSL_TYPE_SUBROUTINE:
    local_c = 0x20;
    break;
  case GLSL_TYPE_FLOAT16:
  case GLSL_TYPE_UINT16:
  case GLSL_TYPE_INT16:
    local_c = 0x10;
    break;
  case GLSL_TYPE_DOUBLE:
  case GLSL_TYPE_UINT64:
  case GLSL_TYPE_INT64:
  case GLSL_TYPE_SAMPLER:
  case GLSL_TYPE_IMAGE:
    local_c = 0x40;
    break;
  case GLSL_TYPE_UINT8:
  case GLSL_TYPE_INT8:
    local_c = 8;
    break;
  case GLSL_TYPE_BOOL:
    local_c = 1;
    break;
  default:
    __assert_fail("!\"unknown base type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.h"
                  ,0xbe,"unsigned int glsl_base_type_get_bit_size(const enum glsl_base_type)");
  }
  return local_c;
}

Assistant:

static inline unsigned int
glsl_base_type_get_bit_size(const enum glsl_base_type base_type)
{
   switch (base_type) {
   case GLSL_TYPE_BOOL:
      return 1;

   case GLSL_TYPE_INT:
   case GLSL_TYPE_UINT:
   case GLSL_TYPE_FLOAT: /* TODO handle mediump */
   case GLSL_TYPE_SUBROUTINE:
      return 32;

   case GLSL_TYPE_FLOAT16:
   case GLSL_TYPE_UINT16:
   case GLSL_TYPE_INT16:
      return 16;

   case GLSL_TYPE_UINT8:
   case GLSL_TYPE_INT8:
      return 8;

   case GLSL_TYPE_DOUBLE:
   case GLSL_TYPE_INT64:
   case GLSL_TYPE_UINT64:
   case GLSL_TYPE_IMAGE:
   case GLSL_TYPE_SAMPLER:
      return 64;

   default:
      unreachable("unknown base type");
   }

   return 0;
}